

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

quaternion * quaternion_get_rotation_tov3(vector3 *from,vector3 *to,quaternion *qR)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  fVar5 = (from->field_0).v[0];
  fVar9 = (from->field_0).v[1];
  fVar1 = (to->field_0).v[2];
  fVar2 = (from->field_0).v[2];
  fVar3 = (to->field_0).v[0];
  fVar4 = (to->field_0).v[1];
  fVar6 = fVar9 * fVar1 - fVar4 * fVar2;
  fVar8 = fVar2 * fVar3 - fVar1 * fVar5;
  fVar7 = fVar5 * fVar4 - fVar3 * fVar9;
  fVar5 = fVar2 * fVar1 + fVar5 * fVar3 + fVar9 * fVar4;
  (qR->field_0).q[0] = fVar6;
  (qR->field_0).q[1] = fVar8;
  (qR->field_0).q[2] = fVar7;
  fVar9 = fVar5 * fVar5 + fVar7 * fVar7 + fVar6 * fVar6 + fVar8 * fVar8;
  (qR->field_0).q[3] = fVar5 + fVar9;
  if (1e-05 <= fVar9) {
    (qR->field_0).q[0] = fVar6 / fVar9;
    (qR->field_0).q[1] = fVar8 / fVar9;
    (qR->field_0).q[2] = fVar7 / fVar9;
    (qR->field_0).q[3] = (fVar5 + fVar9) / fVar9;
  }
  return qR;
}

Assistant:

HYPAPI struct quaternion *quaternion_get_rotation_tov3(const struct vector3 *from, const struct vector3 *to, struct quaternion *qR)
{
	/* this code avoids sqrt and cos and sin and would be nice to
	 * avoid division
	 */
	struct vector3 w;
	HYP_FLOAT dot;
	HYP_FLOAT norm;

	vector3_cross_product(&w, from, to);
	dot = vector3_dot_product(from, to);

	qR->x = w.x;
	qR->y = w.y;
	qR->z = w.z;
	qR->w = dot;

	norm = quaternion_norm(qR);
	qR->w += norm;

	/* normalization with avoidance of div/0 and reusing the norm */
	/* (already calculated above) */
	if (!scalar_equalsf(norm, 0.0f)) {
		qR->x /= norm;
		qR->y /= norm;
		qR->z /= norm;
		qR->w /= norm;
	}

	return qR;
}